

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O1

Boolean MA_get_index(Integer memhandle,MA_AccessIndex *index)

{
  AD *in_RAX;
  Boolean BVar1;
  AD *ad;
  AD *local_18;
  
  ma_stats.calls[5] = ma_stats.calls[5] + 1;
  local_18 = in_RAX;
  BVar1 = mh2ad(memhandle,&local_18,BL_HeapOrStack,"MA_get_index");
  if (BVar1 != 0) {
    *index = (ulong)((long)local_18->client_space - (long)ma_base[local_18->datatype]) /
             (ulong)(long)ma_sizeof[local_18->datatype];
  }
  return (ulong)(BVar1 != 0);
}

Assistant:

public Boolean MA_get_index(
    Integer    memhandle,    /* block to get index for */
    MA_AccessIndex    *index         /* RETURN: base index */)
{
    AD        *ad;        /* AD for memhandle */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_get_index]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (mh2ad(memhandle, &ad, BL_HeapOrStack, "MA_get_index"))
    {
        /* compute index */
        *index = client_space_index(ad);

        /* success */
        return MA_TRUE;
    }
    else
    {
        /* failure */
        return MA_FALSE;
    }
}